

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffparse.c
# Opt level: O0

FT_Error cff_parse_maxstack(CFF_Parser parser)

{
  void *pvVar1;
  FT_Long FVar2;
  FT_Error local_24;
  FT_Error error;
  FT_Byte **data;
  CFF_FontRecDict dict;
  CFF_Parser parser_local;
  
  pvVar1 = parser->object;
  local_24 = 0;
  if (pvVar1 == (void *)0x0) {
    local_24 = 3;
  }
  else {
    FVar2 = cff_parse_num(parser,parser->stack);
    *(int *)((long)pvVar1 + 0x140) = (int)FVar2;
    if (0x201 < *(uint *)((long)pvVar1 + 0x140)) {
      *(undefined4 *)((long)pvVar1 + 0x140) = 0x201;
    }
    if (*(uint *)((long)pvVar1 + 0x140) < 0x201) {
      *(undefined4 *)((long)pvVar1 + 0x140) = 0x201;
    }
  }
  return local_24;
}

Assistant:

static FT_Error
  cff_parse_maxstack( CFF_Parser  parser )
  {
    /* maxstack operator can only be used in a Top DICT */
    CFF_FontRecDict  dict  = (CFF_FontRecDict)parser->object;
    FT_Byte**        data  = parser->stack;
    FT_Error         error = FT_Err_Ok;


    if ( !dict )
    {
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    dict->maxstack = (FT_UInt)cff_parse_num( parser, data++ );
    if ( dict->maxstack > CFF2_MAX_STACK )
      dict->maxstack = CFF2_MAX_STACK;
    if ( dict->maxstack < CFF2_DEFAULT_STACK )
      dict->maxstack = CFF2_DEFAULT_STACK;

    FT_TRACE4(( " %d\n", dict->maxstack ));

  Exit:
    return error;
  }